

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_tile.c
# Opt level: O0

uint64_t TIFFTileRowSize64(TIFF *tif)

{
  TIFF *local_38;
  uint64_t tilerowsize;
  uint64_t rowsize;
  TIFFDirectory *td;
  TIFF *tif_local;
  
  if ((tif->tif_dir).td_tilelength == 0) {
    TIFFErrorExtR(tif,"TIFFTileRowSize64","Tile length is zero");
    tif_local = (TIFF *)0x0;
  }
  else if ((tif->tif_dir).td_tilewidth == 0) {
    TIFFErrorExtR(tif,"TIFFTileRowSize64","Tile width is zero");
    tif_local = (TIFF *)0x0;
  }
  else {
    tilerowsize = _TIFFMultiply64(tif,(ulong)(tif->tif_dir).td_bitspersample,
                                  (ulong)(tif->tif_dir).td_tilewidth,"TIFFTileRowSize");
    if ((tif->tif_dir).td_planarconfig == 1) {
      if ((tif->tif_dir).td_samplesperpixel == 0) {
        TIFFErrorExtR(tif,"TIFFTileRowSize64","Samples per pixel is zero");
        return 0;
      }
      tilerowsize = _TIFFMultiply64(tif,tilerowsize,(ulong)(tif->tif_dir).td_samplesperpixel,
                                    "TIFFTileRowSize");
    }
    if ((tilerowsize & 7) == 0) {
      local_38 = (TIFF *)(tilerowsize >> 3);
    }
    else {
      local_38 = (TIFF *)((tilerowsize >> 3) + 1);
    }
    if (local_38 == (TIFF *)0x0) {
      TIFFErrorExtR(tif,"TIFFTileRowSize64","Computed tile row size is zero");
      tif_local = (TIFF *)0x0;
    }
    else {
      tif_local = local_38;
    }
  }
  return (uint64_t)tif_local;
}

Assistant:

uint64_t TIFFTileRowSize64(TIFF *tif)
{
    static const char module[] = "TIFFTileRowSize64";
    TIFFDirectory *td = &tif->tif_dir;
    uint64_t rowsize;
    uint64_t tilerowsize;

    if (td->td_tilelength == 0)
    {
        TIFFErrorExtR(tif, module, "Tile length is zero");
        return 0;
    }
    if (td->td_tilewidth == 0)
    {
        TIFFErrorExtR(tif, module, "Tile width is zero");
        return (0);
    }
    rowsize = _TIFFMultiply64(tif, td->td_bitspersample, td->td_tilewidth,
                              "TIFFTileRowSize");
    if (td->td_planarconfig == PLANARCONFIG_CONTIG)
    {
        if (td->td_samplesperpixel == 0)
        {
            TIFFErrorExtR(tif, module, "Samples per pixel is zero");
            return 0;
        }
        rowsize = _TIFFMultiply64(tif, rowsize, td->td_samplesperpixel,
                                  "TIFFTileRowSize");
    }
    tilerowsize = TIFFhowmany8_64(rowsize);
    if (tilerowsize == 0)
    {
        TIFFErrorExtR(tif, module, "Computed tile row size is zero");
        return 0;
    }
    return (tilerowsize);
}